

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O2

int __thiscall zmq::dish_t::xjoin(dish_t *this,char *group_)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  msg_t *msg_;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string group;
  msg_t msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&group,group_,(allocator<char> *)&msg);
  if (group._M_string_length < 0x100) {
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->_subscriptions,&group);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      iVar1 = msg_t::init_join(&msg);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
                ,0x6f);
        fflush(_stderr);
        zmq_abort(pcVar4);
      }
      iVar1 = msg_t::set_group(&msg,group_);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
                ,0x72);
        fflush(_stderr);
        zmq_abort(pcVar4);
      }
      msg_ = &msg;
      iVar1 = dist_t::send_to_all(&this->_dist,msg_);
      iVar2 = (int)msg_;
      if (iVar1 == 0) {
        iVar5 = 0;
      }
      else {
        piVar3 = __errno_location();
        iVar5 = *piVar3;
      }
      iVar2 = msg_t::close(&msg,iVar2);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
                ,0x79);
        fflush(_stderr);
        zmq_abort(pcVar4);
      }
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        *piVar3 = iVar5;
      }
      goto LAB_0016e83c;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  iVar1 = -1;
LAB_0016e83c:
  std::__cxx11::string::~string((string *)&group);
  return iVar1;
}

Assistant:

int zmq::dish_t::xjoin (const char *group_)
{
    const std::string group = std::string (group_);

    if (group.length () > ZMQ_GROUP_MAX_LENGTH) {
        errno = EINVAL;
        return -1;
    }

    //  User cannot join same group twice
    if (!_subscriptions.insert (group).second) {
        errno = EINVAL;
        return -1;
    }

    msg_t msg;
    int rc = msg.init_join ();
    errno_assert (rc == 0);

    rc = msg.set_group (group_);
    errno_assert (rc == 0);

    int err = 0;
    rc = _dist.send_to_all (&msg);
    if (rc != 0)
        err = errno;
    const int rc2 = msg.close ();
    errno_assert (rc2 == 0);
    if (rc != 0)
        errno = err;
    return rc;
}